

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

positionTy * __thiscall positionTy::operator*=(positionTy *this,double d)

{
  this->_lat = this->_lat * d;
  this->_lon = this->_lon * d;
  this->_alt = this->_alt * d;
  this->_ts = this->_ts * d;
  this->_head = this->_head * d;
  this->_pitch = this->_pitch * d;
  this->_roll = d * this->_roll;
  return this;
}

Assistant:

positionTy& positionTy::operator*= (double d)
{
    _lat   *= d;
    _lon   *= d;
    _alt   *= d;
    _ts    *= d;
    _head  *= d;
    _pitch *= d;
    _roll  *= d;
    return *this;
}